

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O2

shared_ptr<UIContext> CreateUIContext(GraphicsContext *gc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char (*in_RSI) [8];
  shared_ptr<UIContext> sVar2;
  shared_ptr<GusteauChapter1UI> ui;
  int local_1c;
  GraphicsContext local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  local_1c = 0x400;
  std::make_shared<GusteauChapter1UI,GraphicsContext&,char_const(&)[8],int,int>
            (&local_18,in_RSI,(int *)"gusteau",&local_1c);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gc->_vptr_GraphicsContext = (_func_int **)local_18;
  gc[1]._vptr_GraphicsContext = (_func_int **)_Var1._M_pi;
  local_18._vptr_GraphicsContext = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)gc;
  return (shared_ptr<UIContext>)sVar2.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UIContext> CreateUIContext(GraphicsContext& gc)
{
    auto ui = std::make_shared<GusteauChapter1UI>(gc, "gusteau", 1024, 1024);
    return ui;
}